

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::Path::Path(Path *this,Path *rhs)

{
  bool bVar1;
  
  std::__cxx11::string::string((string *)this,(string *)rhs);
  std::__cxx11::string::string((string *)&this->_prop_part,(string *)&rhs->_prop_part);
  std::__cxx11::string::string((string *)&this->_variant_part,(string *)&rhs->_variant_part);
  std::__cxx11::string::string
            ((string *)&this->_variant_selection_part,(string *)&rhs->_variant_selection_part);
  std::__cxx11::string::string((string *)&this->_variant_part_str,(string *)&rhs->_variant_part_str)
  ;
  std::__cxx11::string::string((string *)&this->_element,(string *)&rhs->_element);
  bVar1 = (rhs->_path_type).has_value_;
  (this->_path_type).has_value_ = bVar1;
  if (bVar1 == true) {
    (this->_path_type).contained = (rhs->_path_type).contained;
  }
  this->_valid = rhs->_valid;
  return;
}

Assistant:

Path(const Path &rhs) = default;